

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O0

void __thiscall Fl_RGB_Image::Fl_RGB_Image(Fl_RGB_Image *this,uchar *bits,int W,int H,int D,int LD)

{
  int LD_local;
  int D_local;
  int H_local;
  int W_local;
  uchar *bits_local;
  Fl_RGB_Image *this_local;
  
  Fl_Image::Fl_Image(&this->super_Fl_Image,W,H,D);
  (this->super_Fl_Image)._vptr_Fl_Image = (_func_int **)&PTR__Fl_RGB_Image_002e5800;
  this->array = bits;
  this->alloc_array = 0;
  this->id_ = 0;
  this->mask_ = 0;
  Fl_Image::data(&this->super_Fl_Image,(char **)&this->array,1);
  Fl_Image::ld(&this->super_Fl_Image,LD);
  return;
}

Assistant:

Fl_RGB_Image::Fl_RGB_Image(const uchar *bits, int W, int H, int D, int LD) :
  Fl_Image(W,H,D),
  array(bits),
  alloc_array(0),
  id_(0),
  mask_(0)
{
    data((const char **)&array, 1);
    ld(LD);
}